

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

uint __thiscall wasm::Type::getByteSize(Type *this)

{
  bool bVar1;
  int iVar2;
  Type *pTVar3;
  Type *t;
  Iterator __end2;
  Iterator __begin2;
  Type *__range2;
  uint size;
  anon_class_1_0_00000001 getSingleByteSize;
  Type *this_local;
  
  _size = this;
  bVar1 = isTuple(this);
  if (bVar1) {
    __range2._0_4_ = 0;
    join_0x00000010_0x00000000_ =
         (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)begin(this);
    _t = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)end(this);
    while( true ) {
      bVar1 = ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator!=
                        ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                         &__end2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                          .index,(ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)&t
                        );
      if (!bVar1) break;
      pTVar3 = Iterator::operator*((Iterator *)
                                   &__end2.
                                    super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                    .index);
      iVar2 = getByteSize::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)((long)&__range2 + 7),(Type)pTVar3->id);
      __range2._0_4_ = iVar2 + (uint)__range2;
      ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator++
                ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                 &__end2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index);
    }
    this_local._4_4_ = (uint)__range2;
  }
  else {
    this_local._4_4_ =
         getByteSize::anon_class_1_0_00000001::operator()
                   ((anon_class_1_0_00000001 *)((long)&__range2 + 7),(Type)this->id);
  }
  return this_local._4_4_;
}

Assistant:

unsigned Type::getByteSize() const {
  // TODO: alignment?
  auto getSingleByteSize = [](Type t) {
    switch (t.getBasic()) {
      case Type::i32:
      case Type::f32:
        return 4;
      case Type::i64:
      case Type::f64:
        return 8;
      case Type::v128:
        return 16;
      case Type::none:
      case Type::unreachable:
        break;
    }
    WASM_UNREACHABLE("invalid type");
  };

  if (isTuple()) {
    unsigned size = 0;
    for (const auto& t : *this) {
      size += getSingleByteSize(t);
    }
    return size;
  }
  return getSingleByteSize(*this);
}